

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

CustomOperator * ExprEval::Operator::get_custom_specification(string *symbol)

{
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *this;
  __type _Var1;
  reference pvVar2;
  ulong __n;
  
  this = custom_operator_table;
  __n = 0;
  while( true ) {
    if ((ulong)(((long)(this->
                       super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->
                      super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x98) <= __n) {
      return (CustomOperator *)0x0;
    }
    pvVar2 = std::
             vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
             ::at(this,__n);
    _Var1 = std::operator==(&pvVar2->symbol,symbol);
    if (_Var1) break;
    __n = __n + 1;
  }
  pvVar2 = std::
           vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
           ::at(this,__n);
  return pvVar2;
}

Assistant:

Operator::CustomOperator* get_custom_specification(const std::string& symbol){
            auto table = custom_operator_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return &(table->at(i));
            }
            return nullptr;
        }